

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

qint64 __thiscall QJsonValue::toInteger(QJsonValue *this,qint64 defaultValue)

{
  Type TVar1;
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar2;
  long in_FS_OFFSET;
  qint64 dblInt;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = (this->value).t;
  if (TVar1 == Double) {
    dblInt = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    eVar2 = anon_unknown.dwarf_3649fc::convertDoubleTo<long_long>
                      ((double)(this->value).n,&dblInt,true);
    if (eVar2) {
      defaultValue = dblInt;
    }
  }
  else if (TVar1 == Integer) {
    defaultValue = (this->value).n;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return defaultValue;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QJsonValue::toInteger(qint64 defaultValue) const
{
    switch (value.type()) {
    case QCborValue::Integer:
        return value.toInteger();
    case QCborValue::Double: {
        qint64 dblInt;
        if (convertDoubleTo<qint64>(toDouble(), &dblInt))
            return dblInt;
        break;
    }
    default:
        break;
    }
    return defaultValue;
}